

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Own<capnp::CallContextHook,_std::nullptr_t> __thiscall
capnp::LocalCallContext::addRef(LocalCallContext *this)

{
  CallContextHook *extraout_RDX;
  _func_int **in_RSI;
  Own<capnp::CallContextHook,_std::nullptr_t> OVar1;
  Own<capnp::LocalCallContext,_std::nullptr_t> local_18;
  
  *(int *)(in_RSI + 3) = *(int *)(in_RSI + 3) + 1;
  local_18.disposer = (Disposer *)(in_RSI + 2);
  (this->super_CallContextHook)._vptr_CallContextHook = (_func_int **)local_18.disposer;
  (this->super_ResponseHook)._vptr_ResponseHook = in_RSI;
  local_18.ptr = (LocalCallContext *)0x0;
  kj::Own<capnp::LocalCallContext,_std::nullptr_t>::dispose(&local_18);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<CallContextHook> addRef() override {
    return kj::addRef(*this);
  }